

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QCommonArrayOps<QSslCertificate>::growAppend
          (QCommonArrayOps<QSslCertificate> *this,QSslCertificate *b,QSslCertificate *e)

{
  qsizetype *pqVar1;
  QSslCertificate *pQVar2;
  QSslCertificate **data;
  QArrayDataPointer<QSslCertificate> *old;
  long lVar3;
  QSslCertificate *pQVar4;
  QSslCertificate *other;
  long in_FS_OFFSET;
  QArrayDataPointer<QSslCertificate> local_48;
  QSslCertificate *local_30;
  long local_28;
  
  old = &local_48;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = b;
  if (b != e) {
    lVar3 = (long)e - (long)b;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QSslCertificate *)0x0;
    local_48.size = 0;
    pQVar2 = (this->super_Type).super_QGenericArrayOps<QSslCertificate>.
             super_QArrayDataPointer<QSslCertificate>.ptr;
    if ((b < pQVar2) ||
       (pQVar2 + (this->super_Type).super_QGenericArrayOps<QSslCertificate>.
                 super_QArrayDataPointer<QSslCertificate>.size <= b)) {
      data = (QSslCertificate **)0x0;
      old = (QArrayDataPointer<QSslCertificate> *)0x0;
    }
    else {
      data = &local_30;
    }
    QArrayDataPointer<QSslCertificate>::detachAndGrow
              ((QArrayDataPointer<QSslCertificate> *)this,GrowsAtEnd,lVar3 >> 3,data,old);
    if ((e != b) && (0 < lVar3)) {
      pQVar4 = (QSslCertificate *)(lVar3 + (long)local_30);
      pQVar2 = (this->super_Type).super_QGenericArrayOps<QSslCertificate>.
               super_QArrayDataPointer<QSslCertificate>.ptr;
      other = local_30;
      do {
        QSslCertificate::QSslCertificate
                  (pQVar2 + (this->super_Type).super_QGenericArrayOps<QSslCertificate>.
                            super_QArrayDataPointer<QSslCertificate>.size,other);
        other = other + 1;
        pqVar1 = &(this->super_Type).super_QGenericArrayOps<QSslCertificate>.
                  super_QArrayDataPointer<QSslCertificate>.size;
        *pqVar1 = *pqVar1 + 1;
      } while (other < pQVar4);
    }
    QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }